

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ssize_t ossl_send(connectdata *conn,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  Curl_easy *pCVar1;
  int ret_code;
  uint uVar2;
  uint *puVar3;
  ulong error;
  char *pcVar4;
  int local_15c;
  int rc;
  int memlen;
  unsigned_long sslerror;
  char error_buffer [256];
  int err;
  CURLcode *curlcode_local;
  size_t len_local;
  void *mem_local;
  int sockindex_local;
  connectdata *conn_local;
  
  ERR_clear_error();
  if (len < 0x80000000) {
    local_15c = (int)len;
  }
  else {
    local_15c = 0x7fffffff;
  }
  ret_code = SSL_write((SSL *)conn->ssl[sockindex].handle,mem,local_15c);
  if (ret_code < 1) {
    uVar2 = SSL_get_error((SSL *)conn->ssl[sockindex].handle,ret_code);
    if (uVar2 == 1) {
      error = ERR_get_error();
      pCVar1 = conn->data;
      pcVar4 = ossl_strerror(error,(char *)&sslerror,0x100);
      Curl_failf(pCVar1,"SSL_write() error: %s",pcVar4);
      *curlcode = CURLE_SEND_ERROR;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
    else if (uVar2 - 2 < 2) {
      *curlcode = CURLE_AGAIN;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
    else if (uVar2 == 5) {
      pCVar1 = conn->data;
      puVar3 = (uint *)__errno_location();
      Curl_failf(pCVar1,"SSL_write() returned SYSCALL, errno = %d",(ulong)*puVar3);
      *curlcode = CURLE_SEND_ERROR;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
    else {
      Curl_failf(conn->data,"SSL_write() return error %d",(ulong)uVar2);
      *curlcode = CURLE_SEND_ERROR;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
  }
  else {
    *curlcode = CURLE_OK;
    conn_local = (connectdata *)(long)ret_code;
  }
  return (ssize_t)conn_local;
}

Assistant:

static ssize_t ossl_send(struct connectdata *conn,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256]; /* OpenSSL documents that this must be at least 256
                             bytes long. */
  unsigned long sslerror;
  int memlen;
  int rc;

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(conn->ssl[sockindex].handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(conn->ssl[sockindex].handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      failf(conn->data, "SSL_write() returned SYSCALL, errno = %d",
            SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      failf(conn->data, "SSL_write() error: %s",
            ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(conn->data, "SSL_write() return error %d", err);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}